

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void __thiscall APlayerPawn::CheckWeaponSwitch(APlayerPawn *this,PClassAmmo *ammotype)

{
  player_t *ppVar1;
  AWeapon *pAVar2;
  undefined8 *puVar3;
  AWeapon *pAVar4;
  undefined8 *puVar5;
  
  ppVar1 = (this->super_AActor).player;
  puVar3 = (undefined8 *)
           ((long)&((ppVar1->userinfo).
                    super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                   Nodes)->Next +
           (ulong)(((ppVar1->userinfo).
                    super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                    Size - 1 & 0x238) * 0x18));
  do {
    puVar5 = puVar3;
    puVar3 = (undefined8 *)*puVar5;
  } while (*(int *)(puVar5 + 1) != 0x238);
  if (((*(char *)(puVar5[2] + 0x28) == '\0') &&
      (ppVar1->PendingWeapon == (AWeapon *)AWeapon::RegistrationInfo.MyClass)) &&
     ((ppVar1->ReadyWeapon == (AWeapon *)0x0 ||
      (((ppVar1->ReadyWeapon->super_AStateProvider).super_AInventory.field_0x4fd & 2) != 0)))) {
    pAVar4 = BestWeapon(this,ammotype);
    if (pAVar4 != (AWeapon *)0x0) {
      ppVar1 = (this->super_AActor).player;
      pAVar2 = ppVar1->ReadyWeapon;
      if ((pAVar2 == (AWeapon *)0x0) || (pAVar4->SelectionOrder < pAVar2->SelectionOrder)) {
        ppVar1->PendingWeapon = pAVar4;
      }
    }
  }
  return;
}

Assistant:

void APlayerPawn::CheckWeaponSwitch(PClassAmmo *ammotype)
{
	if (!player->userinfo.GetNeverSwitch() &&
		player->PendingWeapon == WP_NOCHANGE && 
		(player->ReadyWeapon == NULL ||
		 (player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON)))
	{
		AWeapon *best = BestWeapon (ammotype);
		if (best != NULL && (player->ReadyWeapon == NULL ||
			best->SelectionOrder < player->ReadyWeapon->SelectionOrder))
		{
			player->PendingWeapon = best;
		}
	}
}